

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_derivation_hkdf_read
          (psa_hkdf_key_derivation_t *hkdf,psa_algorithm_t hash_alg,uint8_t *output,
          size_t output_length)

{
  psa_status_t pVar1;
  byte local_40;
  byte local_39;
  uint8_t n;
  psa_status_t status;
  uint8_t hash_length;
  size_t output_length_local;
  uint8_t *output_local;
  psa_algorithm_t hash_alg_local;
  psa_hkdf_key_derivation_t *hkdf_local;
  
  if ((hash_alg & 0xff | 0x1000000) == 0x1000001) {
    local_40 = 0x10;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x1000002) {
    local_40 = 0x10;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x1000003) {
    local_40 = 0x10;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x1000004) {
    local_40 = 0x14;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x1000005) {
    local_40 = 0x14;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x1000008) {
    local_40 = 0x1c;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x1000009) {
    local_40 = 0x20;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x100000a) {
    local_40 = 0x30;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x100000b) {
    local_40 = 0x40;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x100000c) {
    local_40 = 0x1c;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x100000d) {
    local_40 = 0x20;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x1000010) {
    local_40 = 0x1c;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x1000011) {
    local_40 = 0x20;
  }
  else if ((hash_alg & 0xff | 0x1000000) == 0x1000012) {
    local_40 = 0x30;
  }
  else {
    local_40 = 0;
    if ((hash_alg & 0xff | 0x1000000) == 0x1000013) {
      local_40 = 0x40;
    }
  }
  if (((hkdf->field_0x1f2 & 3) < 2) || (((byte)hkdf->field_0x1f2 >> 2 & 1) == 0)) {
    hkdf_local._4_4_ = -0x89;
  }
  else {
    hkdf->field_0x1f2 = hkdf->field_0x1f2 & 0xfc | 3;
    _status = output_length;
    output_length_local = (size_t)output;
    while (_status != 0) {
      local_39 = local_40 - hkdf->offset_in_block;
      if (_status < local_39) {
        local_39 = (byte)_status;
      }
      memcpy((void *)output_length_local,hkdf->output_block + (int)(uint)hkdf->offset_in_block,
             (ulong)local_39);
      output_length_local = output_length_local + (long)(int)(uint)local_39;
      _status = _status - local_39;
      hkdf->offset_in_block = hkdf->offset_in_block + local_39;
      if (_status == 0) break;
      if (hkdf->block_number == 0xff) {
        return -0x89;
      }
      hkdf->block_number = hkdf->block_number + '\x01';
      hkdf->offset_in_block = '\0';
      pVar1 = psa_hmac_setup_internal(&hkdf->hmac,hkdf->prk,(ulong)local_40,hash_alg);
      if (pVar1 != 0) {
        return pVar1;
      }
      if ((hkdf->block_number != '\x01') &&
         (pVar1 = psa_hash_update(&(hkdf->hmac).hash_ctx,hkdf->output_block,(ulong)local_40),
         pVar1 != 0)) {
        return pVar1;
      }
      pVar1 = psa_hash_update(&(hkdf->hmac).hash_ctx,hkdf->info,hkdf->info_length);
      if (pVar1 != 0) {
        return pVar1;
      }
      pVar1 = psa_hash_update(&(hkdf->hmac).hash_ctx,&hkdf->block_number,1);
      if (pVar1 != 0) {
        return pVar1;
      }
      pVar1 = psa_hmac_finish_internal(&hkdf->hmac,hkdf->output_block,0x40);
      if (pVar1 != 0) {
        return pVar1;
      }
    }
    hkdf_local._4_4_ = 0;
  }
  return hkdf_local._4_4_;
}

Assistant:

static psa_status_t psa_key_derivation_hkdf_read( psa_hkdf_key_derivation_t *hkdf,
                                             psa_algorithm_t hash_alg,
                                             uint8_t *output,
                                             size_t output_length )
{
    uint8_t hash_length = PSA_HASH_SIZE( hash_alg );
    psa_status_t status;

    if( hkdf->state < HKDF_STATE_KEYED || ! hkdf->info_set )
        return( PSA_ERROR_BAD_STATE );
    hkdf->state = HKDF_STATE_OUTPUT;

    while( output_length != 0 )
    {
        /* Copy what remains of the current block */
        uint8_t n = hash_length - hkdf->offset_in_block;
        if( n > output_length )
            n = (uint8_t) output_length;
        memcpy( output, hkdf->output_block + hkdf->offset_in_block, n );
        output += n;
        output_length -= n;
        hkdf->offset_in_block += n;
        if( output_length == 0 )
            break;
        /* We can't be wanting more output after block 0xff, otherwise
         * the capacity check in psa_key_derivation_output_bytes() would have
         * prevented this call. It could happen only if the operation
         * object was corrupted or if this function is called directly
         * inside the library. */
        if( hkdf->block_number == 0xff )
            return( PSA_ERROR_BAD_STATE );

        /* We need a new block */
        ++hkdf->block_number;
        hkdf->offset_in_block = 0;
        status = psa_hmac_setup_internal( &hkdf->hmac,
                                          hkdf->prk, hash_length,
                                          hash_alg );
        if( status != PSA_SUCCESS )
            return( status );
        if( hkdf->block_number != 1 )
        {
            status = psa_hash_update( &hkdf->hmac.hash_ctx,
                                      hkdf->output_block,
                                      hash_length );
            if( status != PSA_SUCCESS )
                return( status );
        }
        status = psa_hash_update( &hkdf->hmac.hash_ctx,
                                  hkdf->info,
                                  hkdf->info_length );
        if( status != PSA_SUCCESS )
            return( status );
        status = psa_hash_update( &hkdf->hmac.hash_ctx,
                                  &hkdf->block_number, 1 );
        if( status != PSA_SUCCESS )
            return( status );
        status = psa_hmac_finish_internal( &hkdf->hmac,
                                           hkdf->output_block,
                                           sizeof( hkdf->output_block ) );
        if( status != PSA_SUCCESS )
            return( status );
    }

    return( PSA_SUCCESS );
}